

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  UnlockedPoolAllocatorPrivate *pUVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_0034d950;
  clear(this);
  if ((this->d->payouts).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->d->payouts) {
    ~UnlockedPoolAllocator((UnlockedPoolAllocator *)&this->d);
  }
  pUVar1 = this->d;
  if (pUVar1 == (UnlockedPoolAllocatorPrivate *)0x0) {
    return;
  }
  p_Var3 = (pUVar1->payouts).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&pUVar1->payouts) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x20);
    p_Var3 = p_Var2;
  }
  p_Var3 = (pUVar1->budgets).
           super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&pUVar1->budgets) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x20);
    p_Var3 = p_Var2;
  }
  operator_delete(pUVar1,0x38);
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!d->payouts.empty())
    {
        NCNN_LOGE("FATAL ERROR! unlocked pool allocator destroyed too early");
#if NCNN_STDIO
        std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
        for (; it != d->payouts.end(); ++it)
        {
            void* ptr = it->second;
            NCNN_LOGE("%p still in use", ptr);
        }
#endif
    }

    delete d;
}